

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O3

bool __thiscall OpenMD::SelectionCompiler::lookingAtLeadingWhitespace(SelectionCompiler *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  
  iVar1 = this->cchScript;
  iVar2 = this->ichToken;
  iVar6 = iVar2;
  if (iVar2 < iVar1) {
    pcVar4 = (this->script)._M_dataplus._M_p + iVar2;
    iVar5 = iVar2;
    do {
      iVar3 = isspace((int)*pcVar4);
      iVar6 = iVar5;
      if (iVar3 == 0) break;
      iVar5 = iVar5 + 1;
      pcVar4 = pcVar4 + 1;
      iVar6 = iVar1;
    } while (iVar1 != iVar5);
  }
  this->cchToken = iVar6 - iVar2;
  return iVar6 - iVar2 != 0 && iVar2 <= iVar6;
}

Assistant:

bool SelectionCompiler::lookingAtLeadingWhitespace() {
    int ichT = ichToken;
    while (ichT < cchScript && std::isspace(script[ichT])) {
      ++ichT;
    }
    cchToken = ichT - ichToken;
    return cchToken > 0;
  }